

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::closeHandle(CommonCore *this,InterfaceHandle handle)

{
  byte *pbVar1;
  shared_mutex *__rwlock;
  int iVar2;
  pair<helics::route_id,_helics::ActionMessage> *ppVar3;
  BasicHandleInfo *pBVar4;
  InvalidIdentifier *this_00;
  string_view message;
  ActionMessage cmd;
  ActionMessage AStack_d8;
  
  ppVar3 = getHandleInfo(this,handle);
  if (ppVar3 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "invalid handle";
    message._M_len = 0xe;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (((ppVar3->second).messageID & 0x10000000) == 0) {
    ActionMessage::ActionMessage(&AStack_d8,cmd_close_interface);
    AStack_d8.source_id.gid = (ppVar3->first).rid;
    AStack_d8.source_handle.hid = *(BaseType *)&ppVar3->field_0x4;
    AStack_d8.messageID = (int32_t)(char)(ppVar3->second).messageID;
    BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_d8);
    __rwlock = &(this->handles).m_mutex;
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar2 == 0x23) {
      std::__throw_system_error(0x23);
    }
    pBVar4 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle);
    pbVar1 = (byte *)((long)&pBVar4->flags + 1);
    *pbVar1 = *pbVar1 | 0x10;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    ActionMessage::~ActionMessage(&AStack_d8);
  }
  return;
}

Assistant:

void CommonCore::closeHandle(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    ActionMessage cmd(CMD_CLOSE_INTERFACE);
    cmd.setSource(handleInfo->handle);
    cmd.messageID = static_cast<int32_t>(handleInfo->handleType);
    addActionMessage(cmd);
    handles.modify(
        [handle](auto& hand) { setActionFlag(*hand.getHandleInfo(handle), disconnected_flag); });
}